

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.hpp
# Opt level: O1

bool Limonp::Logger::LoggingF(uint level,char *fileName,int lineNo,string *fmt,...)

{
  uint uVar1;
  char in_AL;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_t __maxlen;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  string msg;
  va_list ap;
  string local_128;
  undefined8 local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [32];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  local_128._M_string_length = 0;
  local_128.field_2._M_local_buf[0] = '\0';
  __maxlen = 0x100;
  local_c8 = in_R8;
  local_c0 = in_R9;
  do {
    iVar4 = (int)__maxlen;
    std::__cxx11::string::resize((ulong)&local_128,(char)__maxlen);
    local_f8 = local_e8;
    local_100 = &stack0x00000008;
    local_108 = 0x3000000020;
    iVar3 = vsnprintf(local_128._M_dataplus._M_p,__maxlen,(fmt->_M_dataplus)._M_p,&local_108);
    if (iVar4 <= iVar3 || iVar3 < 0) {
      uVar1 = iVar4 * 2;
      if (-1 < iVar3) {
        uVar1 = iVar3 + 1;
      }
      __maxlen = (size_t)uVar1;
    }
    else {
      std::__cxx11::string::resize((ulong)&local_128,(char)iVar3);
    }
  } while (iVar4 <= iVar3 || iVar3 < 0);
  bVar2 = Logging(level,&local_128,fileName,lineNo);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  return bVar2;
}

Assistant:

static bool LoggingF(uint level, const char* fileName, int lineNo, const string& fmt, ...)
            {
                int size = 256;
                string msg;
                va_list ap;
                while (1) {
                    msg.resize(size);
                    va_start(ap, fmt);
                    int n = vsnprintf((char *)msg.c_str(), size, fmt.c_str(), ap);
                    va_end(ap);
                    if (n > -1 && n < size) {
                        msg.resize(n);
                        break;
                    }
                    if (n > -1)
                      size = n + 1;
                    else
                      size *= 2;
                }
                return Logging(level, msg, fileName, lineNo);
            }